

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O3

void Fra_ClauStop(Cla_Man_t *p)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  
  if (p->pMapCsMainToCsTest != (int *)0x0) {
    free(p->pMapCsMainToCsTest);
    p->pMapCsMainToCsTest = (int *)0x0;
  }
  if (p->pMapCsTestToCsMain != (int *)0x0) {
    free(p->pMapCsTestToCsMain);
    p->pMapCsTestToCsMain = (int *)0x0;
  }
  if (p->pMapCsTestToNsTest != (int *)0x0) {
    free(p->pMapCsTestToNsTest);
    p->pMapCsTestToNsTest = (int *)0x0;
  }
  if (p->pMapCsTestToNsBmc != (int *)0x0) {
    free(p->pMapCsTestToNsBmc);
    p->pMapCsTestToNsBmc = (int *)0x0;
  }
  pVVar1 = p->vSatVarsMainCs;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vSatVarsTestCs;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vSatVarsTestNs;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vSatVarsBmcNs;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vCexMain0;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vCexMain;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vCexTest;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vCexBase;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vCexAssm;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vCexBmc;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  if (p->pSatMain != (sat_solver *)0x0) {
    sat_solver_delete(p->pSatMain);
  }
  if (p->pSatTest != (sat_solver *)0x0) {
    sat_solver_delete(p->pSatTest);
  }
  if (p->pSatBmc != (sat_solver *)0x0) {
    sat_solver_delete(p->pSatBmc);
  }
  free(p);
  return;
}

Assistant:

void Fra_ClauStop( Cla_Man_t * p )
{
    ABC_FREE( p->pMapCsMainToCsTest );
    ABC_FREE( p->pMapCsTestToCsMain );
    ABC_FREE( p->pMapCsTestToNsTest );
    ABC_FREE( p->pMapCsTestToNsBmc  );
    Vec_IntFree( p->vSatVarsMainCs );
    Vec_IntFree( p->vSatVarsTestCs );
    Vec_IntFree( p->vSatVarsTestNs );
    Vec_IntFree( p->vSatVarsBmcNs );
    Vec_IntFree( p->vCexMain0 );
    Vec_IntFree( p->vCexMain );
    Vec_IntFree( p->vCexTest );
    Vec_IntFree( p->vCexBase );
    Vec_IntFree( p->vCexAssm );
    Vec_IntFree( p->vCexBmc  );
    if ( p->pSatMain ) sat_solver_delete( p->pSatMain );
    if ( p->pSatTest ) sat_solver_delete( p->pSatTest );
    if ( p->pSatBmc )  sat_solver_delete( p->pSatBmc );
    ABC_FREE( p );
}